

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# agg_rasterizer_scanline_aa.h
# Opt level: O1

bool __thiscall
agg::rasterizer_scanline_aa<agg::rasterizer_sl_clip<agg::ras_conv_int>_>::
sweep_scanline<agg::scanline_p8>
          (rasterizer_scanline_aa<agg::rasterizer_sl_clip<agg::ras_conv_int>_> *this,scanline_p8 *sl
          )

{
  span *psVar1;
  sorted_y *psVar2;
  bool bVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  cell_aa **ppcVar8;
  cell_aa **ppcVar9;
  int iVar10;
  uint uVar11;
  int iVar12;
  uint uVar13;
  cell_aa *pcVar14;
  bool bVar15;
  
  iVar12 = this->m_scan_y;
  iVar10 = (this->m_outline).m_max_y;
  bVar3 = iVar12 <= iVar10;
  if (iVar12 <= iVar10) {
    do {
      sl->m_last_x = 0x7ffffff0;
      psVar1 = (sl->m_spans).m_array;
      sl->m_cover_ptr = (sl->m_covers).m_array;
      sl->m_cur_span = psVar1;
      psVar1->len = 0;
      uVar11 = iVar12 - (this->m_outline).m_min_y;
      psVar2 = (this->m_outline).m_sorted_y.m_array;
      uVar13 = psVar2[uVar11].num;
      if (uVar13 != 0) {
        ppcVar9 = (this->m_outline).m_sorted_cells.m_array + psVar2[uVar11].start;
        iVar12 = 0;
        do {
          pcVar14 = *ppcVar9;
          iVar10 = pcVar14->x;
          iVar4 = pcVar14->area;
          iVar12 = iVar12 + pcVar14->cover;
          uVar13 = uVar13 - 1;
          bVar15 = uVar13 == 0;
          if (!bVar15) {
            pcVar14 = ppcVar9[1];
            ppcVar8 = ppcVar9;
            while (ppcVar9 = ppcVar8 + 1, pcVar14->x == iVar10) {
              iVar4 = iVar4 + pcVar14->area;
              iVar12 = iVar12 + pcVar14->cover;
              bVar15 = uVar13 == 1;
              if (bVar15) {
                uVar13 = 0;
                break;
              }
              uVar13 = uVar13 - 1;
              pcVar14 = ppcVar8[2];
              ppcVar8 = ppcVar9;
            }
          }
          if (iVar4 != 0) {
            uVar6 = iVar12 * 0x200 - iVar4 >> 9;
            uVar11 = -uVar6;
            if (0 < (int)uVar6) {
              uVar11 = uVar6;
            }
            uVar7 = uVar11 & 0x1ff;
            uVar6 = 0x200 - uVar7;
            if (uVar7 < 0x101) {
              uVar6 = uVar7;
            }
            if (this->m_filling_rule != fill_even_odd) {
              uVar6 = uVar11;
            }
            if (0xfe < (int)uVar6) {
              uVar6 = 0xff;
            }
            if (this->m_gamma[uVar6] != 0) {
              scanline_p8::add_cell(sl,iVar10,this->m_gamma[uVar6]);
            }
            iVar10 = iVar10 + 1;
          }
          if ((!bVar15) && (uVar11 = pcVar14->x - iVar10, uVar11 != 0 && iVar10 <= pcVar14->x)) {
            uVar7 = (iVar12 << 9) >> 9;
            uVar6 = -uVar7;
            if (0 < (int)uVar7) {
              uVar6 = uVar7;
            }
            uVar5 = uVar6 & 0x1ff;
            uVar7 = 0x200 - uVar5;
            if (uVar5 < 0x101) {
              uVar7 = uVar5;
            }
            if (this->m_filling_rule != fill_even_odd) {
              uVar7 = uVar6;
            }
            if (0xfe < (int)uVar7) {
              uVar7 = 0xff;
            }
            if (this->m_gamma[uVar7] != 0) {
              scanline_p8::add_span(sl,iVar10,uVar11,this->m_gamma[uVar7]);
            }
          }
        } while (uVar13 != 0);
      }
      iVar10 = this->m_scan_y;
      if ((int)((ulong)((long)sl->m_cur_span - (long)(sl->m_spans).m_array) >> 4) != 0) {
        sl->m_y = iVar10;
        this->m_scan_y = iVar10 + 1;
        return bVar3;
      }
      iVar12 = iVar10 + 1;
      this->m_scan_y = iVar12;
      iVar4 = (this->m_outline).m_max_y;
      bVar3 = iVar10 < iVar4;
    } while (iVar10 < iVar4);
  }
  return bVar3;
}

Assistant:

bool sweep_scanline(Scanline& sl)
        {
            for(;;)
            {
                if(m_scan_y > m_outline.max_y()) return false;
                sl.reset_spans();
                unsigned num_cells = m_outline.scanline_num_cells(m_scan_y);
                const cell_aa* const* cells = m_outline.scanline_cells(m_scan_y);
                int cover = 0;

                while(num_cells)
                {
                    const cell_aa* cur_cell = *cells;
                    int x    = cur_cell->x;
                    int area = cur_cell->area;
                    unsigned alpha;

                    cover += cur_cell->cover;

                    //accumulate all cells with the same X
                    while(--num_cells)
                    {
                        cur_cell = *++cells;
                        if(cur_cell->x != x) break;
                        area  += cur_cell->area;
                        cover += cur_cell->cover;
                    }

                    if(area)
                    {
                        alpha = calculate_alpha((cover << (poly_subpixel_shift + 1)) - area);
                        if(alpha)
                        {
                            sl.add_cell(x, alpha);
                        }
                        x++;
                    }

                    if(num_cells && cur_cell->x > x)
                    {
                        alpha = calculate_alpha(cover << (poly_subpixel_shift + 1));
                        if(alpha)
                        {
                            sl.add_span(x, cur_cell->x - x, alpha);
                        }
                    }
                }
        
                if(sl.num_spans()) break;
                ++m_scan_y;
            }

            sl.finalize(m_scan_y);
            ++m_scan_y;
            return true;
        }